

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O1

void __thiscall TSMuxer::flushTSBuffer(TSMuxer *this)

{
  MuxerManager *this_00;
  int iVar1;
  undefined4 extraout_var;
  undefined4 *puVar2;
  ostringstream ss;
  uint *local_1f0;
  undefined8 local_1e8;
  uint local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  uint *local_1d0;
  undefined8 local_1c8;
  uint local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  uint *local_1b0;
  undefined8 local_1a8;
  uint local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  ostringstream local_190 [376];
  
  this_00 = (this->super_AbstractMuxer).m_owner;
  if (this_00->m_asyncMode == true) {
    MuxerManager::waitForWriting(this_00);
  }
  iVar1 = (*(this->m_muxFile->super_AbstractStream)._vptr_AbstractStream[4])();
  if (CONCAT44(extraout_var,iVar1) == -1) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Can\'t determine size for file ",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,(this->m_outFileName)._M_dataplus._M_p,
               (this->m_outFileName)._M_string_length);
    puVar2 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar2 = 0x69;
    *(undefined4 **)(puVar2 + 2) = puVar2 + 6;
    if (local_1b0 == &local_1a0) {
      puVar2[6] = local_1a0;
      puVar2[7] = uStack_19c;
      puVar2[8] = uStack_198;
      puVar2[9] = uStack_194;
    }
    else {
      *(uint **)(puVar2 + 2) = local_1b0;
      *(ulong *)(puVar2 + 6) = CONCAT44(uStack_19c,local_1a0);
    }
    *(undefined8 *)(puVar2 + 4) = local_1a8;
    local_1a8 = 0;
    local_1a0 = local_1a0 & 0xffffff00;
    local_1b0 = &local_1a0;
    __cxa_throw(puVar2,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  (*(this->m_muxFile->super_AbstractStream)._vptr_AbstractStream[3])();
  iVar1 = (*(this->m_muxFile->super_AbstractStream)._vptr_AbstractStream[2])
                    (this->m_muxFile,(this->m_outFileName)._M_dataplus._M_p,6,0);
  if ((char)iVar1 == '\0') {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Can\'t reopen file ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,(this->m_outFileName)._M_dataplus._M_p,
               (this->m_outFileName)._M_string_length);
    puVar2 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar2 = 0x69;
    *(undefined4 **)(puVar2 + 2) = puVar2 + 6;
    if (local_1d0 == &local_1c0) {
      puVar2[6] = local_1c0;
      puVar2[7] = uStack_1bc;
      puVar2[8] = uStack_1b8;
      puVar2[9] = uStack_1b4;
    }
    else {
      *(uint **)(puVar2 + 2) = local_1d0;
      *(ulong *)(puVar2 + 6) = CONCAT44(uStack_1bc,local_1c0);
    }
    *(undefined8 *)(puVar2 + 4) = local_1c8;
    local_1c8 = 0;
    local_1c0 = local_1c0 & 0xffffff00;
    local_1d0 = &local_1c0;
    __cxa_throw(puVar2,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  iVar1 = (*(this->m_muxFile->super_AbstractStream)._vptr_AbstractStream[5])
                    (this->m_muxFile,this->m_outBuf,(ulong)(uint)this->m_outBufLen);
  if (iVar1 == this->m_outBufLen) {
    if (this->m_outBuf != (uint8_t *)0x0) {
      operator_delete__(this->m_outBuf);
    }
    this->m_outBufLen = 0;
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Can\'t write last data block to file ",0x24);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,(this->m_outFileName)._M_dataplus._M_p,
             (this->m_outFileName)._M_string_length);
  puVar2 = (undefined4 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar2 = 0x69;
  *(undefined4 **)(puVar2 + 2) = puVar2 + 6;
  if (local_1f0 == &local_1e0) {
    puVar2[6] = local_1e0;
    puVar2[7] = uStack_1dc;
    puVar2[8] = uStack_1d8;
    puVar2[9] = uStack_1d4;
  }
  else {
    *(uint **)(puVar2 + 2) = local_1f0;
    *(ulong *)(puVar2 + 6) = CONCAT44(uStack_1dc,local_1e0);
  }
  *(undefined8 *)(puVar2 + 4) = local_1e8;
  local_1e0 = local_1e0 & 0xffffff00;
  __cxa_throw(puVar2,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

void TSMuxer::flushTSBuffer()
{
    if (m_owner->isAsyncMode())
        m_owner->waitForWriting();

    const int64_t fileSize = m_muxFile->size();
    if (fileSize == -1)
        THROW(ERR_FILE_COMMON, "Can't determine size for file " << m_outFileName)
    m_muxFile->close();

    if (!m_muxFile->open(m_outFileName.c_str(), File::ofWrite + File::ofAppend))
        THROW(ERR_FILE_COMMON, "Can't reopen file " << m_outFileName)

    if (writeOutFile(m_outBuf, m_outBufLen) != m_outBufLen)
        THROW(ERR_FILE_COMMON, "Can't write last data block to file " << m_outFileName)
    delete[] m_outBuf;
    m_outBufLen = 0;
}